

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O1

void __thiscall jessilib::thread_pool::thread_pool(thread_pool *this,size_t in_threads)

{
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *this_00;
  pointer ptVar1;
  long lVar2;
  long *local_50;
  undefined8 local_48;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *local_40;
  queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
  *local_38;
  
  std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::vector
            (&this->m_threads,in_threads,(allocator_type *)&local_50);
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_inactive_threads).c.
  super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>::
  _M_initialize_map((_Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
                     *)&this->m_inactive_threads,0);
  this_00 = &this->m_tasks;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tasks).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  local_38 = &this->m_inactive_threads;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )this_00,0);
  *(undefined8 *)((long)&(this->m_tasks_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_tasks_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_tasks_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_tasks_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_inactive_threads_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_inactive_threads_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_inactive_threads_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_inactive_threads_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_threads_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_inactive_threads_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_threads_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_threads_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_threads_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_threads_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_tasks_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_40 = this_00;
  if (in_threads == 0) {
    __assert_fail("in_threads != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/thread_pool.cpp"
                  ,0x27,"jessilib::thread_pool::thread_pool(size_t)");
  }
  lVar2 = in_threads * 0x88;
  while( true ) {
    ptVar1 = (this->m_threads).
             super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = 0;
    local_50 = (long *)operator_new(0x18);
    *local_50 = (long)&PTR___State_001b1ed0;
    local_50[1] = (long)this;
    local_50[2] = (long)(&ptVar1[-1].m_active + lVar2);
    std::thread::_M_start_thread(&local_48,&local_50,0);
    if (local_50 != (long *)0x0) {
      (**(code **)(*local_50 + 8))();
    }
    if (*(long *)((long)&ptVar1[-1].m_thread._M_id + lVar2) != 0) break;
    in_threads = in_threads - 1;
    *(undefined8 *)((long)&ptVar1[-1].m_thread._M_id + lVar2) = local_48;
    lVar2 = lVar2 + -0x88;
    if (in_threads == 0) {
      return;
    }
  }
  std::terminate();
}

Assistant:

thread_pool::thread_pool(size_t in_threads)
	: m_threads{ in_threads } {
	assert(in_threads != 0);

	while (in_threads != 0) {
		thread& worker = m_threads[--in_threads];
		worker.m_thread = std::thread([this, &worker]() {
			while (true) {
				// Run next pending task, if there is any
				worker.m_task = pop_task();
				if (worker.m_task != nullptr) {
					worker.run_task();
					continue;
				}

				{
					// Check if we're shutting down
					std::unique_lock<std::mutex> notifier_guard(worker.m_notifier_mutex);
					if (worker.m_shutdown) {
						break;
					}

					// Push inactive thread
					{
						std::lock_guard<std::mutex> inactive_threads_guard(m_inactive_threads_mutex);
						m_inactive_threads.push(&worker);
					}

					// Wait for notification
					worker.m_notifier.wait(notifier_guard);
				}

				// Run task
				worker.run_task();
			}
		});
	}
}